

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O1

EStatusCode __thiscall
CFFPrimitiveReader::ReadOffset(CFFPrimitiveReader *this,unsigned_long *outValue)

{
  int iVar1;
  EStatusCode EVar2;
  ulong in_RAX;
  undefined4 extraout_var;
  ulong uVar3;
  bool bVar4;
  Byte buffer;
  unsigned_short shortBuffer;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  switch(this->mCurrentOffsize) {
  case '\x01':
    if (this->mInternalState == eFailure) {
      EVar2 = eFailure;
      uVar3 = 0;
    }
    else {
      iVar1 = (*(this->mCFFFile->super_IByteReader)._vptr_IByteReader[2])
                        (this->mCFFFile,(long)&uStack_18 + 5,1);
      bVar4 = CONCAT44(extraout_var,iVar1) != 1;
      if (bVar4) {
        this->mInternalState = eFailure;
      }
      EVar2 = -(uint)bVar4;
      uVar3 = uStack_18 >> 0x28 & 0xff;
    }
    if (EVar2 != eSuccess) {
      return EVar2;
    }
    *outValue = uVar3;
    break;
  case '\x02':
    EVar2 = ReadCard16(this,(unsigned_short *)((long)&uStack_18 + 6));
    if (EVar2 != eSuccess) {
      return EVar2;
    }
    *outValue = uStack_18 >> 0x30;
    break;
  case '\x03':
    EVar2 = Read3ByteUnsigned(this,outValue);
    return EVar2;
  case '\x04':
    EVar2 = Read4ByteUnsigned(this,outValue);
    return EVar2;
  default:
    return eFailure;
  }
  return eSuccess;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadOffset(unsigned long& outValue)
{
	EStatusCode status = PDFHummus::eFailure;

	switch(mCurrentOffsize)
	{
		case 1:
			Byte byteBuffer;
			status = ReadCard8(byteBuffer);
			if(PDFHummus::eSuccess == status)
				outValue = byteBuffer;
			break;
		case 2:
			unsigned short shortBuffer;
			status = ReadCard16(shortBuffer);
			if(PDFHummus::eSuccess == status)
				outValue = shortBuffer;
			break;
		case 3:
			status = Read3ByteUnsigned(outValue);
			break;
		case 4:
			status = Read4ByteUnsigned(outValue);
			break;

	}

	return status;
}